

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_graph_cpy(ggml_cgraph *src,ggml_cgraph *dst)

{
  _Bool _Var1;
  size_t i_00;
  size_t i_01;
  int *in_RSI;
  long in_RDI;
  size_t igrad_dst;
  size_t igrad_src;
  int i_3;
  size_t i_2;
  int i_1;
  int i;
  ggml_tensor *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  ggml_tensor *key;
  int iVar3;
  int iVar4;
  
  if (*in_RSI < *(int *)(in_RDI + 8)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x177b,"GGML_ASSERT(%s) failed","dst->size >= src->n_leafs");
  }
  if (*in_RSI < *(int *)(in_RDI + 4)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x177c,"GGML_ASSERT(%s) failed","dst->size >= src->n_nodes");
  }
  if (*(ulong *)(in_RSI + 0xc) < *(ulong *)(in_RDI + 0x30)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x177d,"GGML_ASSERT(%s) failed",
               "dst->visited_hash_set.size >= src->visited_hash_set.size");
  }
  in_RSI[2] = *(int *)(in_RDI + 8);
  in_RSI[1] = *(int *)(in_RDI + 4);
  in_RSI[0x12] = *(int *)(in_RDI + 0x48);
  for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 8); iVar4 = iVar4 + 1) {
    *(undefined8 *)(*(long *)(in_RSI + 10) + (long)iVar4 * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x28) + (long)iVar4 * 8);
  }
  for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 4); iVar3 = iVar3 + 1) {
    *(undefined8 *)(*(long *)(in_RSI + 4) + (long)iVar3 * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x10) + (long)iVar3 * 8);
  }
  for (key = (ggml_tensor *)0x0; key < *(ggml_tensor **)(in_RDI + 0x30);
      key = (ggml_tensor *)((long)&key->type + 1)) {
    _Var1 = ggml_bitset_get(*(ggml_bitset_t **)(in_RDI + 0x38),(size_t)key);
    if (_Var1) {
      ggml_hash_insert((ggml_hash_set *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0);
    }
  }
  if (*(long *)(in_RSI + 6) != 0) {
    memset(*(void **)(in_RSI + 6),0,*(long *)(in_RSI + 0xc) << 3);
    memset(*(void **)(in_RSI + 8),0,*(long *)(in_RSI + 0xc) << 3);
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    if (*(long *)(in_RSI + 6) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x1797,"GGML_ASSERT(%s) failed","dst->grads != NULL");
    }
    if (*(long *)(in_RSI + 8) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x1798,"GGML_ASSERT(%s) failed","dst->grad_accs != NULL");
    }
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 4); iVar2 = iVar2 + 1) {
      i_00 = ggml_hash_find((ggml_hash_set *)CONCAT44(iVar4,iVar3),key);
      i_01 = ggml_hash_find((ggml_hash_set *)CONCAT44(iVar4,iVar3),key);
      if (i_00 == 0xffffffffffffffff) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x179d,"GGML_ASSERT(%s) failed","igrad_src != GGML_HASHSET_FULL");
      }
      _Var1 = ggml_bitset_get(*(ggml_bitset_t **)(in_RDI + 0x38),i_00);
      if (!_Var1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x179e,"GGML_ASSERT(%s) failed",
                   "ggml_bitset_get(src->visited_hash_set.used, igrad_src)");
      }
      if (i_01 == 0xffffffffffffffff) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x179f,"GGML_ASSERT(%s) failed","igrad_dst != GGML_HASHSET_FULL");
      }
      _Var1 = ggml_bitset_get(*(ggml_bitset_t **)(in_RSI + 0xe),i_01);
      if (!_Var1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x17a0,"GGML_ASSERT(%s) failed",
                   "ggml_bitset_get(dst->visited_hash_set.used, igrad_dst)");
      }
      *(undefined8 *)(*(long *)(in_RSI + 6) + i_01 * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x18) + i_00 * 8);
      *(undefined8 *)(*(long *)(in_RSI + 8) + i_01 * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x20) + i_00 * 8);
    }
  }
  return;
}

Assistant:

void ggml_graph_cpy(struct ggml_cgraph * src, struct ggml_cgraph * dst) {
    GGML_ASSERT(dst->size >= src->n_leafs);
    GGML_ASSERT(dst->size >= src->n_nodes);
    GGML_ASSERT(dst->visited_hash_set.size >= src->visited_hash_set.size);

    dst->n_leafs = src->n_leafs;
    dst->n_nodes = src->n_nodes;
    dst->order   = src->order;

    for (int i = 0; i < src->n_leafs; ++i) {
        dst->leafs[i] = src->leafs[i];
    }

    for (int i = 0; i < src->n_nodes; ++i) {
        dst->nodes[i] = src->nodes[i];
    }

    for (size_t i = 0; i < src->visited_hash_set.size; ++i) {
        // copy all hashset keys (tensors) that are in use
        if (ggml_bitset_get(src->visited_hash_set.used, i)) {
            ggml_hash_insert(&dst->visited_hash_set, src->visited_hash_set.keys[i]);
        }
    }

    if (dst->grads) {
        memset(dst->grads,     0, dst->visited_hash_set.size*sizeof(struct ggml_tensor *));
        memset(dst->grad_accs, 0, dst->visited_hash_set.size*sizeof(struct ggml_tensor *));
    }
    if (src->grads) {
        GGML_ASSERT(dst->grads     != NULL);
        GGML_ASSERT(dst->grad_accs != NULL);
        for (int i = 0; i < src->n_nodes; ++i) {
            const size_t igrad_src = ggml_hash_find(&src->visited_hash_set, src->nodes[i]);
            const size_t igrad_dst = ggml_hash_find(&dst->visited_hash_set, dst->nodes[i]);

            GGML_ASSERT(igrad_src != GGML_HASHSET_FULL);
            GGML_ASSERT(ggml_bitset_get(src->visited_hash_set.used, igrad_src));
            GGML_ASSERT(igrad_dst != GGML_HASHSET_FULL);
            GGML_ASSERT(ggml_bitset_get(dst->visited_hash_set.used, igrad_dst));

            dst->grads[igrad_dst]     = src->grads[igrad_src];
            dst->grad_accs[igrad_dst] = src->grad_accs[igrad_src];
        }
    }
}